

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_ffh_tostring(lua_State *L)

{
  int iVar1;
  TValue *o;
  cTValue *pcVar2;
  ulong uVar3;
  GCstr *pGVar4;
  
  o = lj_lib_checkany(L,1);
  L->top = o + 1;
  pcVar2 = lj_meta_lookup(L,o,MM_tostring);
  if ((pcVar2->field_2).it == 0xffffffff) {
    uVar3 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar3 + 0x54) <= *(uint *)(uVar3 + 0x50)) {
      lj_gc_step(L);
    }
    pcVar2 = L->base;
    pGVar4 = lj_strfmt_obj(L,pcVar2);
    pcVar2[-1].u32.lo = (uint32_t)pGVar4;
    *(undefined4 *)((long)pcVar2 + -4) = 0xfffffffb;
    iVar1 = 2;
  }
  else {
    L->base[-1] = *pcVar2;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

LJLIB_ASM(tostring)		LJLIB_REC(.)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo;
  L->top = o+1;  /* Only keep one argument. */
  if (!tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  }
  lj_gc_check(L);
  setstrV(L, L->base-1-LJ_FR2, lj_strfmt_obj(L, L->base));
  return FFH_RES(1);
}